

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O0

int __thiscall
GetNameTest::SubmitRecord(GetNameTest *this,uint8_t *packet,uint32_t length,uint32_t start)

{
  int iVar1;
  uint32_t local_20;
  int ldata;
  uint32_t start_local;
  uint32_t length_local;
  uint8_t *packet_local;
  GetNameTest *this_local;
  
  iVar1 = SubmitName(this,packet,length,start);
  local_20 = length;
  if ((iVar1 + 10U <= length) &&
     (iVar1 + (uint)CONCAT11(packet[iVar1 + 8],packet[iVar1 + 9]) + 10 <= length)) {
    local_20 = CONCAT11(packet[iVar1 + 8],packet[iVar1 + 9]) + 10 + iVar1;
  }
  return local_20;
}

Assistant:

int GetNameTest::SubmitRecord(uint8_t * packet, uint32_t length, uint32_t start)
{
    int ldata = 0;

    /* Labels are only tabulated in responses, to avoid polluting data with erroneous packets */
    start = SubmitName(packet, length, start);

    if ((start + 10) > length)
    {
        start = length;
    }
    else
    {
        ldata = (packet[start + 8] << 8) | packet[start + 9];

        if (start + ldata + 10 > length)
        {
            start = length;
        }
        else
        {
            start += ldata + 10;
        }
    }

    return start;
}